

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int bbSPIClose(uint CS)

{
  int iVar1;
  ulong uVar2;
  FILE *pFVar3;
  int iVar4;
  char *__format;
  
  pFVar3 = _stderr;
  uVar2 = (ulong)CS;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(pFVar3,"%s %s: CS=%d\n",myTimeStamp::buf,"bbSPIClose",uVar2);
  }
  pFVar3 = _stderr;
  if (libInitialised == '\0') {
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    fprintf(pFVar3,"%s %s: pigpio uninitialised, call gpioInitialise()\n",myTimeStamp::buf,
            "bbSPIClose");
    return -0x1f;
  }
  if (CS < 0x20) {
    if (wfRx[uVar2].mode == 7) {
      myGpioSetMode(wfRx[uVar2].field_4.I.SDA,wfRx[uVar2].field_4.s.nextBitDiff);
      wfRx[uVar2].mode = 0;
      iVar4 = wfRx[uVar2].field_4.s.readPos;
      iVar1 = wfRx[iVar4].field_4.s.writePos;
      wfRx[iVar4].field_4.s.writePos = iVar1 + -1;
      if (1 < iVar1) {
        return 0;
      }
      myGpioSetMode(wfRx[iVar4].field_4.I.SCL,wfRx[iVar4].field_4.s.timeout);
      myGpioSetMode(wfRx[iVar4].field_4.s.bufSize,wfRx[iVar4].field_4.s.startBitTick);
      myGpioSetMode(wfRx[iVar4].field_4.s.readPos,wfRx[iVar4].field_4.s.bit);
      wfRx[wfRx[iVar4].field_4.I.SCL].mode = 0;
      wfRx[wfRx[iVar4].field_4.I.delay].mode = 0;
      wfRx[wfRx[iVar4].field_4.s.readPos].mode = 0;
      return 0;
    }
    iVar4 = -0x8e;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x8e;
    }
    myTimeStamp();
    __format = "%s %s: no SPI on gpio (%d)\n";
  }
  else {
    iVar4 = -2;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -2;
    }
    myTimeStamp();
    __format = "%s %s: bad gpio (%d)\n";
  }
  fprintf(pFVar3,__format,myTimeStamp::buf,"bbSPIClose",uVar2);
  return iVar4;
}

Assistant:

int bbSPIClose(unsigned CS)
{
   int SCLK;

   DBG(DBG_USER, "CS=%d", CS);

   CHECK_INITED;

   if (CS > PI_MAX_USER_GPIO)
      SOFT_ERROR(PI_BAD_USER_GPIO, "bad gpio (%d)", CS);

   switch(wfRx[CS].mode)
   {
      case PI_WFRX_SPI_CS:

         myGpioSetMode(wfRx[CS].S.CS, wfRx[CS].S.CSMode);
         wfRx[CS].mode = PI_WFRX_NONE;

         SCLK = wfRx[CS].S.SCLK;

         if (--wfRx[SCLK].S.usage <= 0)
         {
            myGpioSetMode(wfRx[SCLK].S.MISO, wfRx[SCLK].S.MISOMode);
            myGpioSetMode(wfRx[SCLK].S.MOSI, wfRx[SCLK].S.MOSIMode);
            myGpioSetMode(wfRx[SCLK].S.SCLK, wfRx[SCLK].S.SCLKMode);

            wfRx[wfRx[SCLK].S.MISO].mode = PI_WFRX_NONE;
            wfRx[wfRx[SCLK].S.MOSI].mode = PI_WFRX_NONE;
            wfRx[wfRx[SCLK].S.SCLK].mode = PI_WFRX_NONE;
         }

         break;

      default:

         SOFT_ERROR(PI_NOT_SPI_GPIO, "no SPI on gpio (%d)", CS);

         break;

   }

   return 0;
}